

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status cmsys::SystemTools::GetPermissions(char *file,mode_t *mode)

{
  allocator<char> local_41;
  string local_40;
  mode_t *local_20;
  mode_t *mode_local;
  char *file_local;
  
  local_20 = mode;
  mode_local = (mode_t *)file;
  if (file == (char *)0x0) {
    file_local = (char *)Status::POSIX(0x16);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,file,&local_41);
    file_local = (char *)GetPermissions(&local_40,local_20);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return (Status)file_local;
}

Assistant:

Status SystemTools::GetPermissions(const char* file, mode_t& mode)
{
  if (!file) {
    return Status::POSIX(EINVAL);
  }
  return SystemTools::GetPermissions(std::string(file), mode);
}